

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void tidyPrintWindowsLanguageNames(ctmbstr format)

{
  ctmbstr ptVar1;
  ctmbstr ptVar2;
  ctmbstr posixName;
  ctmbstr winName;
  TidyIterator i;
  tidyLocaleMapItem *item;
  ctmbstr format_local;
  
  item = (tidyLocaleMapItem *)format;
  winName = (ctmbstr)getWindowsLanguageList();
  while (winName != (ctmbstr)0x0) {
    i = (TidyIterator)getNextWindowsLanguage((TidyIterator *)&winName);
    ptVar1 = TidyLangWindowsName((tidyLocaleMapItem *)i);
    ptVar2 = TidyLangPosixName((tidyLocaleMapItem *)i);
    if (item == (tidyLocaleMapItem *)0x0) {
      printf("%-20s -> %s\n",ptVar1,ptVar2);
    }
    else {
      printf((char *)item,ptVar1,ptVar2);
    }
  }
  return;
}

Assistant:

void tidyPrintWindowsLanguageNames( ctmbstr format )
{
    const tidyLocaleMapItem *item;
    TidyIterator i = getWindowsLanguageList();
    ctmbstr winName;
    ctmbstr posixName;

    while (i) {
        item = getNextWindowsLanguage(&i);
        winName = TidyLangWindowsName( item );
        posixName = TidyLangPosixName( item );
        if ( format )
            printf( format, winName, posixName );
        else
            printf( "%-20s -> %s\n", winName, posixName );
    }
}